

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void test_stateless_hrr_aad_change(void)

{
  int iVar1;
  ptls_t *tls;
  ptls_t *ppVar2;
  size_t consumed;
  ptls_buffer_t sbuf;
  size_t local_100;
  ptls_buffer_t local_f8;
  ptls_buffer_t local_d8;
  undefined1 local_b8 [80];
  char *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  ptls_raw_extension_t *ppStack_50;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *local_48;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *p_Stack_40;
  
  local_48 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0;
  p_Stack_40 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)
               0x0;
  ppStack_50 = (ptls_raw_extension_t *)0x0;
  local_b8._64_8_ = 0;
  local_b8._48_8_ = (uint8_t *)0x0;
  local_b8._56_8_ = 0;
  local_b8._32_8_ = (size_t *)0x0;
  local_b8._40_8_ = 0;
  local_b8._16_8_ = (uint8_t *)0x0;
  local_b8._24_8_ = 0;
  local_b8._0_8_ = (ptls_iovec_t *)0x0;
  local_b8._8_8_ = 0;
  local_b8._72_8_ = "0123456789abcdef0123456789abcdef0123456789abcdef";
  local_68 = "1.2.3.4:1234";
  uStack_60 = 0xc;
  local_58 = 3;
  tls = ptls_new(ctx,0);
  ppVar2 = ptls_new(ctx_peer,1);
  local_d8.base = "";
  local_d8.capacity = 0;
  local_d8.off = 0;
  local_d8._24_8_ = (ulong)(uint)local_d8._28_4_ << 0x20;
  local_f8.base = "";
  local_f8.capacity = 0;
  local_f8.off = 0;
  local_f8.is_allocated = 0;
  iVar1 = ptls_handshake(tls,&local_d8,(void *)0x0,(size_t *)0x0,(ptls_handshake_properties_t *)0x0)
  ;
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x44f);
  local_100 = local_d8.off;
  iVar1 = ptls_handshake(ppVar2,&local_f8,local_d8.base,&local_100,
                         (ptls_handshake_properties_t *)local_b8);
  _ok((uint)(iVar1 == 0x206),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x453);
  (*ptls_clear_memory)(local_d8.base,local_d8.off);
  if (local_d8.is_allocated != 0) {
    free(local_d8.base);
  }
  local_d8.off = 0;
  local_d8._24_8_ = 0;
  local_d8.base = (uint8_t *)0x0;
  local_d8.capacity = 0;
  ptls_free(ppVar2);
  local_d8.base = "";
  local_d8.capacity = 0;
  local_d8.off = 0;
  local_d8._24_8_ = local_d8._24_8_ & 0xffffffff00000000;
  local_100 = local_f8.off;
  iVar1 = ptls_handshake(tls,&local_d8,local_f8.base,&local_100,(ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x46d);
  _ok((uint)(local_f8.off == local_100),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x46e);
  local_f8.off = 0;
  ppVar2 = ptls_new(ctx_peer,1);
  local_68 = "1.2.3.4:4321";
  uStack_60 = 0xc;
  local_100 = local_d8.off;
  iVar1 = ptls_handshake(ppVar2,&local_f8,local_d8.base,&local_100,
                         (ptls_handshake_properties_t *)local_b8);
  _ok((uint)(iVar1 == 0x28),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x476);
  ptls_free(tls);
  ptls_free(ppVar2);
  (*ptls_clear_memory)(local_d8.base,local_d8.off);
  if (local_d8.is_allocated != 0) {
    free(local_d8.base);
  }
  local_d8.off = 0;
  local_d8.is_allocated = 0;
  local_d8._28_4_ = 0;
  local_d8.base = (uint8_t *)0x0;
  local_d8.capacity = 0;
  (*ptls_clear_memory)(local_f8.base,local_f8.off);
  if (local_f8.is_allocated != 0) {
    free(local_f8.base);
  }
  return;
}

Assistant:

static void test_stateless_hrr_aad_change(void)
{
    ptls_t *client, *server;
    ptls_handshake_properties_t server_hs_prop = {{{{NULL}}}};
    ptls_buffer_t cbuf, sbuf;
    size_t consumed;
    int ret;

    server_hs_prop.server.cookie.key = "0123456789abcdef0123456789abcdef0123456789abcdef";
    server_hs_prop.server.cookie.additional_data = ptls_iovec_init("1.2.3.4:1234", 12);
    server_hs_prop.server.enforce_retry = 1;
    server_hs_prop.server.retry_uses_cookie = 1;

    client = stateless_hrr_prepare(&sbuf, &server_hs_prop);
    ptls_buffer_init(&cbuf, "", 0);

    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(sbuf.off == consumed);
    sbuf.off = 0;

    server = ptls_new(ctx_peer, 1);
    server_hs_prop.server.cookie.additional_data = ptls_iovec_init("1.2.3.4:4321", 12);

    consumed = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, &server_hs_prop);
    ok(ret == PTLS_ALERT_HANDSHAKE_FAILURE);

    ptls_free(client);
    ptls_free(server);

    ptls_buffer_dispose(&cbuf);
    ptls_buffer_dispose(&sbuf);
}